

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ThreadSafeArena::CleanupList(ThreadSafeArena *this)

{
  SerialArenaChunk *pSVar1;
  SerialArena *arena;
  SerialArenaChunk *this_00;
  Nonnull<const_char_*> pcVar2;
  long lVar3;
  Span<std::atomic<google::protobuf::internal::SerialArena_*>_> SVar4;
  
  this_00 = (this->head_)._M_b._M_p;
  while( true ) {
    if (((ulong)this_00 & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                    ,0x1fe,
                    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long, 1>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>, std::integer_sequence<unsigned long, 0, 1>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long, 1>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1>, N = 0UL, Char = const char]"
                   );
    }
    if (*(int *)(this_00 + 8) == 0) break;
    pSVar1 = *(SerialArenaChunk **)this_00;
    SVar4 = SerialArenaChunk::arenas(this_00);
    this_00 = pSVar1;
    if (SVar4.len_ != 0) {
      lVar3 = SVar4.len_ << 3;
      do {
        arena = *(SerialArena **)((long)&SVar4.ptr_[-1]._M_b._M_p + lVar3);
        if (arena == (SerialArena *)0x0) {
          pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                             ((void *)0x0,(void *)0x0,"serial != nullptr");
        }
        else {
          pcVar2 = (Nonnull<const_char_*>)0x0;
        }
        if (pcVar2 != (Nonnull<const_char_*>)0x0) {
          CleanupList();
        }
        cleanup::ChunkList::Cleanup(&arena->cleanup_list_,arena);
        lVar3 = lVar3 + -8;
      } while (lVar3 != 0);
    }
  }
  cleanup::ChunkList::Cleanup(&(this->first_arena_).cleanup_list_,&this->first_arena_);
  return;
}

Assistant:

void ThreadSafeArena::CleanupList() {
  if constexpr (HasMemoryPoisoning()) {
    UnpoisonAllArenaBlocks();
  }

  WalkSerialArenaChunk([](SerialArenaChunk* chunk) {
    absl::Span<std::atomic<SerialArena*>> span = chunk->arenas();
    // Walks arenas backward to handle the first serial arena the last.
    // Destroying in reverse-order to the construction is often assumed by users
    // and required not to break inter-object dependencies. (b/247560530)
    for (auto it = span.rbegin(); it != span.rend(); ++it) {
      SerialArena* serial = it->load(std::memory_order_relaxed);
      ABSL_DCHECK_NE(serial, nullptr);
      serial->CleanupList();
    }
  });
  // First arena must be cleaned up last. (b/247560530)
  first_arena_.CleanupList();
}